

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile
          (FileGenerator *this,FileDescriptor *file,CrossFileReferences *refs)

{
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  __hashtable *__h;
  int index;
  long lVar3;
  __hashtable *__h_1;
  long lVar4;
  FileDescriptor *dep;
  FileDescriptor *local_48;
  anon_class_16_2_3fe543fb local_40;
  
  local_40.this = this;
  local_40.refs = refs;
  if (0 < *(int *)(file + 0x2c)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      ForEachField<google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
                ((Descriptor *)(*(long *)(file + 0x58) + lVar4),&local_40);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x88;
    } while (lVar3 < *(int *)(file + 0x2c));
  }
  if (0 < *(int *)(file + 0x3c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      GetCrossFileReferencesForField(this,(FieldDescriptor *)(*(long *)(file + 0x70) + lVar3),refs);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x48;
    } while (lVar4 < *(int *)(file + 0x3c));
  }
  FVar2 = GetOptimizeFor(file,&this->options_,(bool *)0x0);
  if ((FVar2 != FileOptions_OptimizeMode_LITE_RUNTIME) && (0 < *(int *)(file + 0x20))) {
    index = 0;
    do {
      local_48 = FileDescriptor::dependency(file,index);
      bVar1 = IsDepWeak(this,local_48);
      local_40.this = (FileGenerator *)&refs->strong_reflection_files;
      if (bVar1) {
        local_40.this = (FileGenerator *)&refs->weak_reflection_files;
      }
      std::
      _Hashtable<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::FileDescriptor_const*>,std::hash<google::protobuf::FileDescriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<google::protobuf::FileDescriptor_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<google::protobuf::FileDescriptor_const*,false>>>>
                ((_Hashtable<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::FileDescriptor_const*>,std::hash<google::protobuf::FileDescriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_40.this,&local_48,&local_40);
      index = index + 1;
    } while (index < *(int *)(file + 0x20));
  }
  return;
}

Assistant:

void FileGenerator::GetCrossFileReferencesForFile(const FileDescriptor* file,
                                                  CrossFileReferences* refs) {
  ForEachField(file, [this, refs](const FieldDescriptor* field) {
    GetCrossFileReferencesForField(field, refs);
  });

  if (!HasDescriptorMethods(file, options_)) return;

  for (int i = 0; i < file->dependency_count(); i++) {
    const FileDescriptor* dep = file->dependency(i);
    if (IsDepWeak(dep)) {
      refs->weak_reflection_files.insert(dep);
    } else {
      refs->strong_reflection_files.insert(dep);
    }
  }
}